

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O0

void __thiscall QFontComboBoxPrivate::updateModel(QFontComboBoxPrivate *this)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  Int IVar4;
  ulong uVar5;
  QStringListModel *pQVar6;
  QSignalBlocker *pQVar7;
  QFontComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QString *family;
  QStringList *__range1;
  int offset;
  WritingSystem system;
  QFontFamilyDelegate *delegate;
  QStringListModel *m;
  int spacingMask;
  int scalableMask;
  QFontComboBox *q;
  const_iterator __end1;
  const_iterator __begin1;
  QFontInfo fi;
  QStringList result;
  QStringList list;
  QAccessibleTableModelChangeEvent accessibleEvent;
  QSignalBlocker blocker;
  undefined4 in_stack_fffffffffffffdc8;
  FontFilter in_stack_fffffffffffffdcc;
  QSignalBlocker *in_stack_fffffffffffffdd0;
  QFont *this_00;
  undefined6 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffdde;
  byte in_stack_fffffffffffffddf;
  QSignalBlocker *in_stack_fffffffffffffde0;
  int index;
  QSignalBlocker *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  undefined1 local_138 [48];
  undefined1 local_108 [28];
  QFlagsStorageHelper<QFontComboBox::FontFilter,_4> local_ec;
  QFlagsStorageHelper<QFontComboBox::FontFilter,_4> local_e8;
  QFlagsStorageHelper<QFontComboBox::FontFilter,_4> local_e4;
  undefined1 local_e0 [28];
  QFlagsStorageHelper<QFontComboBox::FontFilter,_4> local_c4;
  QFlagsStorageHelper<QFontComboBox::FontFilter,_4> local_c0;
  QFlagsStorageHelper<QFontComboBox::FontFilter,_4> local_bc;
  QString *local_b8;
  const_iterator local_b0;
  const_iterator local_a8;
  undefined1 *local_a0;
  QList<QString> local_98;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  QFont local_68 [16];
  QFont local_58 [16];
  QAccessibleTableModelChangeEvent local_48 [48];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  uVar5 = QCoreApplication::closingDown();
  if ((uVar5 & 1) == 0) {
    QComboBox::model((QComboBox *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    pQVar6 = qobject_cast<QStringListModel*>((QObject *)0x5998f9);
    if (pQVar6 != (QStringListModel *)0x0) {
      QComboBox::view((QComboBox *)in_stack_fffffffffffffdd0);
      QAbstractItemView::itemDelegate((QAbstractItemView *)0x599926);
      qobject_cast<QFontFamilyDelegate*>((QObject *)0x59992e);
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      QFontDatabase::families((WritingSystem)&local_80);
      local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QList<QString>::QList((QList<QString> *)0x5999e0);
      local_a0 = &DAT_aaaaaaaaaaaaaaaa;
      QFontInfo::QFontInfo((QFontInfo *)&local_a0,&in_RDI->currentFont);
      local_a8.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffdd0);
      local_b0.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_b0 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffdd0);
      while( true ) {
        local_b8 = local_b0.i;
        bVar1 = QList<QString>::const_iterator::operator!=(&local_a8,local_b0);
        if (!bVar1) break;
        pQVar7 = (QSignalBlocker *)QList<QString>::const_iterator::operator*(&local_a8);
        uVar5 = QFontDatabase::isPrivateFamily((QString *)pQVar7);
        if ((uVar5 & 1) == 0) {
          local_bc.super_QFlagsStorage<QFontComboBox::FontFilter>.i =
               (QFlagsStorage<QFontComboBox::FontFilter>)
               QFlags<QFontComboBox::FontFilter>::operator&
                         ((QFlags<QFontComboBox::FontFilter> *)in_stack_fffffffffffffdd0,
                          in_stack_fffffffffffffdcc);
          IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_bc);
          bVar1 = false;
          if (IVar4 != 0) {
            local_c0.super_QFlagsStorage<QFontComboBox::FontFilter>.i =
                 (QFlagsStorage<QFontComboBox::FontFilter>)
                 QFlags<QFontComboBox::FontFilter>::operator&
                           ((QFlags<QFontComboBox::FontFilter> *)in_stack_fffffffffffffdd0,
                            in_stack_fffffffffffffdcc);
            IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c0);
            bVar1 = IVar4 != 3;
          }
          if (bVar1) {
            local_c4.super_QFlagsStorage<QFontComboBox::FontFilter>.i =
                 (QFlagsStorage<QFontComboBox::FontFilter>)
                 QFlags<QFontComboBox::FontFilter>::operator&
                           ((QFlags<QFontComboBox::FontFilter> *)in_stack_fffffffffffffdd0,
                            in_stack_fffffffffffffdcc);
            IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c4);
            QString::QString((QString *)0x599b9d);
            bVar3 = QFontDatabase::isSmoothlyScalable((QString *)pQVar7,(QString *)local_e0);
            QString::~QString((QString *)0x599bc5);
            if ((IVar4 != 0) != (bool)(bVar3 & 1)) goto LAB_00599e55;
          }
          local_e4.super_QFlagsStorage<QFontComboBox::FontFilter>.i =
               (QFlagsStorage<QFontComboBox::FontFilter>)
               QFlags<QFontComboBox::FontFilter>::operator&
                         ((QFlags<QFontComboBox::FontFilter> *)in_stack_fffffffffffffdd0,
                          in_stack_fffffffffffffdcc);
          IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_e4);
          bVar1 = false;
          if (IVar4 != 0) {
            local_e8.super_QFlagsStorage<QFontComboBox::FontFilter>.i =
                 (QFlagsStorage<QFontComboBox::FontFilter>)
                 QFlags<QFontComboBox::FontFilter>::operator&
                           ((QFlags<QFontComboBox::FontFilter> *)in_stack_fffffffffffffdd0,
                            in_stack_fffffffffffffdcc);
            IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_e8);
            bVar1 = IVar4 != 0xc;
          }
          bVar3 = in_stack_fffffffffffffddf;
          if (bVar1) {
            local_ec.super_QFlagsStorage<QFontComboBox::FontFilter>.i =
                 (QFlagsStorage<QFontComboBox::FontFilter>)
                 QFlags<QFontComboBox::FontFilter>::operator&
                           ((QFlags<QFontComboBox::FontFilter> *)in_stack_fffffffffffffdd0,
                            in_stack_fffffffffffffdcc);
            IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_ec);
            QString::QString((QString *)0x599ca0);
            bVar2 = QFontDatabase::isFixedPitch((QString *)pQVar7,(QString *)local_108);
            QString::~QString((QString *)0x599cc8);
            bVar3 = in_stack_fffffffffffffddf;
            if ((IVar4 != 0) != (bool)(bVar2 & 1)) goto LAB_00599e55;
          }
          QList<QString>::operator+=
                    ((QList<QString> *)in_stack_fffffffffffffdd0,
                     (parameter_type)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          in_stack_fffffffffffffde8 = pQVar7;
          QFontInfo::family();
          bVar1 = ::operator==((QString *)in_stack_fffffffffffffdd0,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          in_stack_fffffffffffffddf = 1;
          if (!bVar1) {
            QFontInfo::family();
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT17(bVar3,CONCAT16(in_stack_fffffffffffffdde,
                                                       in_stack_fffffffffffffdd8)),
                       (size_t)in_stack_fffffffffffffdd0);
            ::operator+((QString *)
                        CONCAT17(bVar3,CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)
                                ),(QLatin1String *)in_stack_fffffffffffffdd0);
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QString,_QLatin1String> *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
            in_stack_fffffffffffffddf =
                 QString::startsWith((QString *)pQVar7,(CaseSensitivity)local_138);
            QString::~QString((QString *)0x599df8);
            QStringBuilder<QString,_QLatin1String>::~QStringBuilder
                      ((QStringBuilder<QString,_QLatin1String> *)0x599e0e);
            QString::~QString((QString *)0x599e24);
            in_stack_fffffffffffffde0 = pQVar7;
          }
          QString::~QString((QString *)0x599e31);
          if ((in_stack_fffffffffffffddf & 1) != 0) {
            QList<QString>::size(&local_98);
          }
        }
LAB_00599e55:
        QList<QString>::const_iterator::operator++(&local_a8);
      }
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QSignalBlocker::QSignalBlocker
                (in_stack_fffffffffffffde0,
                 (QObject *)
                 CONCAT17(in_stack_fffffffffffffddf,
                          CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)));
      QStringListModel::setStringList((QList_conflict2 *)pQVar6);
      uVar5 = QAccessible::isActive();
      if ((uVar5 & 1) != 0) {
        memset(local_48,0xaa,0x30);
        QComboBox::view((QComboBox *)in_stack_fffffffffffffdd0);
        QAccessibleTableModelChangeEvent::QAccessibleTableModelChangeEvent
                  ((QAccessibleTableModelChangeEvent *)in_stack_fffffffffffffde0,
                   (QObject *)
                   CONCAT17(in_stack_fffffffffffffddf,
                            CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
                   (ModelChangeType)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
        QAccessible::updateAccessibility((QAccessibleEvent *)local_48);
        QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent(local_48);
      }
      index = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
      QSignalBlocker::~QSignalBlocker(in_stack_fffffffffffffdd0);
      bVar1 = QList<QString>::isEmpty((QList<QString> *)0x599f24);
      if (bVar1) {
        this_00 = &in_RDI->currentFont;
        QFont::QFont(local_58);
        bVar3 = QFont::operator!=(this_00,local_58);
        QFont::~QFont(local_58);
        if ((bVar3 & 1) != 0) {
          QFont::QFont(local_68);
          QFont::operator=(this_00,(QFont *)CONCAT44(in_stack_fffffffffffffdcc,
                                                     in_stack_fffffffffffffdc8));
          QFont::~QFont(local_68);
          QFontComboBox::currentFontChanged
                    ((QFontComboBox *)this_00,
                     (QFont *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        }
      }
      else {
        QComboBox::setCurrentIndex((QComboBox *)in_stack_fffffffffffffde8,index);
      }
      QFontInfo::~QFontInfo((QFontInfo *)&local_a0);
      QList<QString>::~QList((QList<QString> *)0x599ff3);
      QList<QString>::~QList((QList<QString> *)0x59a000);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontComboBoxPrivate::updateModel()
{
    Q_Q(QFontComboBox);

    if (QCoreApplication::closingDown())
        return;

    const int scalableMask = (QFontComboBox::ScalableFonts | QFontComboBox::NonScalableFonts);
    const int spacingMask = (QFontComboBox::ProportionalFonts | QFontComboBox::MonospacedFonts);

    QStringListModel *m = qobject_cast<QStringListModel *>(q->model());
    if (!m)
        return;
    QFontFamilyDelegate *delegate = qobject_cast<QFontFamilyDelegate *>(q->view()->itemDelegate());
    QFontDatabase::WritingSystem system = delegate ? delegate->writingSystem : QFontDatabase::Any;

    const QStringList list = QFontDatabase::families(system);
    QStringList result;

    int offset = 0;
    QFontInfo fi(currentFont);

    for (const auto &family : list) {
        if (QFontDatabase::isPrivateFamily(family))
            continue;

        if ((filters & scalableMask) && (filters & scalableMask) != scalableMask) {
            if (bool(filters & QFontComboBox::ScalableFonts) != QFontDatabase::isSmoothlyScalable(family))
                continue;
        }
        if ((filters & spacingMask) && (filters & spacingMask) != spacingMask) {
            if (bool(filters & QFontComboBox::MonospacedFonts) != QFontDatabase::isFixedPitch(family))
                continue;
        }
        result += family;
        if (family == fi.family() || family.startsWith(fi.family() + " ["_L1))
            offset = result.size() - 1;
    }

    //we need to block the signals so that the model doesn't emit reset
    //this prevents the current index from changing
    //it will be updated just after this
    ///TODO: we should finda way to avoid blocking signals and have a real update of the model
    {
        const QSignalBlocker blocker(m);
        m->setStringList(result);
        // Since the modelReset signal is blocked the view will not emit an accessibility event
    #if QT_CONFIG(accessibility)
        if (QAccessible::isActive()) {
            QAccessibleTableModelChangeEvent accessibleEvent(q->view(), QAccessibleTableModelChangeEvent::ModelReset);
            QAccessible::updateAccessibility(&accessibleEvent);
        }
    #endif
    }

    if (result.isEmpty()) {
        if (currentFont != QFont()) {
            currentFont = QFont();
            emit q->currentFontChanged(currentFont);
        }
    } else {
        q->setCurrentIndex(offset);
    }
}